

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_mesh_modifiers.h
# Opt level: O2

void __thiscall ON_EdgeSoftening::~ON_EdgeSoftening(ON_EdgeSoftening *this)

{
  ON_MeshModifier::~ON_MeshModifier(&this->super_ON_MeshModifier);
  operator_delete(this,0x10);
  return;
}

Assistant:

class ON_CLASS ON_EdgeSoftening : public ON_MeshModifier
{
public:
  ON_EdgeSoftening();
  ON_EdgeSoftening(const ON_XMLNode& node);
  ON_EdgeSoftening(const ON_EdgeSoftening& es);

  const ON_EdgeSoftening& operator = (const ON_EdgeSoftening& es);

  bool operator == (const ON_EdgeSoftening& es) const;
  bool operator != (const ON_EdgeSoftening& es) const;

  // Specifies whether the feature is enabled or not.
  bool On(void) const;
  void SetOn(bool b);

  // The softening radius.
  double Softening(void) const;
  void SetSoftening(double d);

  // Specifies whether to chamfer the edges.
  bool Chamfer(void) const;
  void SetChamfer(bool b);

  // Specifies whether the edges are faceted.
  bool Faceted(void) const;
  void SetFaceted(bool b);

  // Threshold angle (in degrees) which controls whether an edge is softened or not.
  // The angle refers to the angles between the adjacent faces of an edge.
  double EdgeAngleThreshold(void) const;
  void SetEdgeAngleThreshold(double d);

  // Specifies whether to soften edges despite too large a radius.
  bool ForceSoftening(void) const;
  void SetForceSoftening(bool b);

  virtual ON_UUID Uuid(void) const override;

  class ON_CLASS Defaults final
  {
  public:
    static bool Chamfer(void);
    static bool Faceted(void);
    static bool ForceSoftening(void);
    static double Softening(void);
    static double EdgeAngleThreshold(void);
  };
}